

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

char * logging_get_names(void)

{
  Node *pNVar1;
  Node *pNVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  iterator i;
  Node *pNVar6;
  char *pcVar7;
  char *pcVar8;
  
  pcVar8 = jh_log_names_buffer;
  if (jh_log_names_buffer == (char *)0x0) {
    pNVar1 = file_data_list->mTail;
    pNVar2 = file_data_list->mHead->next;
    if (pNVar2 != pNVar1) {
      uVar5 = 1;
      pNVar6 = pNVar2;
      do {
        sVar3 = strlen((pNVar6->val).filename);
        uVar5 = uVar5 + (int)sVar3 + 1;
        pNVar6 = pNVar6->next;
      } while (pNVar6 != pNVar1);
      if (uVar5 != 1) {
        pcVar4 = (char *)malloc((ulong)uVar5);
        pcVar8 = pcVar4;
        jh_log_names_buffer = pcVar4;
        for (; pNVar2 != pNVar1; pNVar2 = pNVar2->next) {
          strcpy(pcVar8,(pNVar2->val).filename);
          sVar3 = strlen((pNVar2->val).filename);
          pcVar7 = pcVar8 + sVar3;
          pcVar8 = pcVar7 + 1;
          *pcVar7 = ' ';
        }
        pcVar8[-1] = '\0';
        return pcVar4;
      }
    }
    pcVar8 = (char *)0x0;
  }
  return pcVar8;
}

Assistant:

const char* logging_get_names()
{
	uint32_t size = 1;
	char* temp;

	TRACE_BEGIN(LOG_LVL_INFO);
	
	if ( jh_log_names_buffer != NULL )
		return jh_log_names_buffer;
	
	// else figure out size, make buffer and copy data into it.

	LOG( "calculating storage size" );
	for (JetHead::list<file_data>::iterator i = file_data_list->begin(); 
		 i != file_data_list->end(); ++i)
	{
		size += strlen(i->filename) + 1;
	}

	// if no file in list yet.
	if (size == 1) 
		return NULL;

	jh_log_names_buffer = (char*)LOGGING_MALLOC( size );	
	temp = jh_log_names_buffer;

	for (JetHead::list<file_data>::iterator i = file_data_list->begin(); 
		 i != file_data_list->end(); ++i)
	{
		strcpy( temp, i->filename );
		temp += strlen( i->filename );
		*temp = ' ';
		temp++;
	}

	temp--;
	*temp = '\0';

	return jh_log_names_buffer;
}